

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathArcToFast(ImDrawList *this,ImVec2 *centre,float radius,int amin,int amax)

{
  int *piVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 *pIVar5;
  ImVec2 *pIVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  int i;
  int iVar9;
  int iVar10;
  long lVar11;
  int a;
  float fVar12;
  float fVar13;
  
  if (PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx == '\0') {
    PathArcToFast();
  }
  if (PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx_builds == '\0') {
    lVar11 = 0;
    do {
      fVar12 = (float)(int)lVar11 / 12.0;
      fVar12 = (fVar12 + fVar12) * 3.1415927;
      fVar13 = cosf(fVar12);
      PathArcToFast::circle_vtx[lVar11].x = fVar13;
      fVar12 = sinf(fVar12);
      PathArcToFast::circle_vtx[lVar11].y = fVar12;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0xc);
    PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx_builds = '\x01';
  }
  pIVar7 = GImGui;
  if (amax < amin) {
    return;
  }
  iVar9 = (this->_Path).Size;
  if ((radius != 0.0) || (NAN(radius))) {
    iVar9 = (amax - amin) + iVar9 + 1;
    if (iVar9 <= (this->_Path).Capacity) goto LAB_0013b3cc;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar5 = (ImVec2 *)(*(pIVar7->IO).MemAllocFn)((long)iVar9 << 3);
    pIVar6 = (this->_Path).Data;
    if (pIVar6 == (ImVec2 *)0x0) {
LAB_0013b3b8:
      pIVar6 = (ImVec2 *)0x0;
      pIVar7 = GImGui;
    }
    else {
      memcpy(pIVar5,pIVar6,(long)(this->_Path).Size << 3);
      pIVar7 = GImGui;
      pIVar6 = (this->_Path).Data;
      if (pIVar6 == (ImVec2 *)0x0) goto LAB_0013b3b8;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar7->IO).MemFreeFn)(pIVar6);
    (this->_Path).Data = pIVar5;
    (this->_Path).Capacity = iVar9;
LAB_0013b3cc:
    do {
      pIVar7 = GImGui;
      IVar2 = *centre;
      IVar3 = PathArcToFast::circle_vtx
              [(int)(amin + (((uint)(amin / 6 + (amin >> 0x1f)) >> 1) - (amin >> 0x1f)) * -0xc)];
      iVar9 = (this->_Path).Size;
      if (iVar9 == (this->_Path).Capacity) {
        if (iVar9 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar9 / 2 + iVar9;
        }
        iVar10 = iVar9 + 1;
        if (iVar9 + 1 < iVar8) {
          iVar10 = iVar8;
        }
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar6 = (ImVec2 *)(*(pIVar7->IO).MemAllocFn)((long)iVar10 << 3);
        pIVar5 = (this->_Path).Data;
        if (pIVar5 == (ImVec2 *)0x0) {
LAB_0013b49d:
          pIVar5 = (ImVec2 *)0x0;
          pIVar7 = GImGui;
        }
        else {
          memcpy(pIVar6,pIVar5,(long)(this->_Path).Size << 3);
          pIVar7 = GImGui;
          pIVar5 = (this->_Path).Data;
          if (pIVar5 == (ImVec2 *)0x0) goto LAB_0013b49d;
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(pIVar7->IO).MemFreeFn)(pIVar5);
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar10;
        iVar9 = (this->_Path).Size;
      }
      else {
        pIVar6 = (this->_Path).Data;
      }
      (this->_Path).Size = iVar9 + 1;
      IVar4.y = IVar3.y * radius + IVar2.y;
      IVar4.x = IVar3.x * radius + IVar2.x;
      pIVar6[iVar9] = IVar4;
      amin = amin + 1;
      if (amax + 1 == amin) {
        return;
      }
    } while( true );
  }
  if (iVar9 != (this->_Path).Capacity) {
    pIVar6 = (this->_Path).Data;
    goto LAB_0013b397;
  }
  if (iVar9 == 0) {
    iVar8 = 8;
  }
  else {
    iVar8 = iVar9 / 2 + iVar9;
  }
  iVar10 = iVar9 + 1;
  if (iVar9 + 1 < iVar8) {
    iVar10 = iVar8;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pIVar6 = (ImVec2 *)(*(pIVar7->IO).MemAllocFn)((long)iVar10 << 3);
  pIVar5 = (this->_Path).Data;
  if (pIVar5 == (ImVec2 *)0x0) {
LAB_0013b383:
    pIVar5 = (ImVec2 *)0x0;
    pIVar7 = GImGui;
  }
  else {
    memcpy(pIVar6,pIVar5,(long)(this->_Path).Size << 3);
    pIVar7 = GImGui;
    pIVar5 = (this->_Path).Data;
    if (pIVar5 == (ImVec2 *)0x0) goto LAB_0013b383;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar7->IO).MemFreeFn)(pIVar5);
  (this->_Path).Data = pIVar6;
  (this->_Path).Capacity = iVar10;
  iVar9 = (this->_Path).Size;
LAB_0013b397:
  (this->_Path).Size = iVar9 + 1;
  pIVar6[iVar9] = *centre;
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& centre, float radius, int amin, int amax)
{
    static ImVec2 circle_vtx[12];
    static bool circle_vtx_builds = false;
    const int circle_vtx_count = IM_ARRAYSIZE(circle_vtx);
    if (!circle_vtx_builds)
    {
        for (int i = 0; i < circle_vtx_count; i++)
        {
            const float a = ((float)i / (float)circle_vtx_count) * 2*IM_PI;
            circle_vtx[i].x = cosf(a);
            circle_vtx[i].y = sinf(a);
        }
        circle_vtx_builds = true;
    }

    if (amin > amax) return;
    if (radius == 0.0f)
    {
        _Path.push_back(centre);
    }
    else
    {
        _Path.reserve(_Path.Size + (amax - amin + 1));
        for (int a = amin; a <= amax; a++)
        {
            const ImVec2& c = circle_vtx[a % circle_vtx_count];
            _Path.push_back(ImVec2(centre.x + c.x * radius, centre.y + c.y * radius));
        }
    }
}